

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall dg::debug::DG2Dot<dg::LLVMNode>::reopen(DG2Dot<dg::LLVMNode> *this,char *new_file)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
  }
  pcVar2 = "/dev/stdout";
  if (new_file != (char *)0x0) {
    pcVar2 = new_file;
  }
  std::ofstream::open((char *)&this->out,(_Ios_Openmode)pcVar2);
  this->file = pcVar2;
  return;
}

Assistant:

void reopen(const char *new_file) {
        if (!new_file)
            new_file = "/dev/stdout";

        if (out.is_open())
            out.close();

        out.open(new_file);
        file = new_file;
    }